

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

string * __thiscall
booster::locale::impl_std::utf8_moneypunct_from_wide<true>::do_curr_symbol_abi_cxx11_
          (utf8_moneypunct_from_wide<true> *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x40));
  return in_RDI;
}

Assistant:

virtual std::string do_curr_symbol() const
    {
        return curr_symbol_;
    }